

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_Detail::M3<-25>,_Detail::M3<27>,_Detail::M2<9>,_Detail::M3<1>,_Detail::M1,_Detail::M3<-9>,_Detail::M3<-21>,_Detail::M3<21>,_Detail::MatsumotoKuritaTempering<3832420096U,_2609283072U>_>,_608087765U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_Detail::M3<_25>,_Detail::M3<27>,_Detail::M2<9>,_Detail::M3<1>,_Detail::M1,_Detail::M3<_9>,_Detail::M3<_21>,_Detail::M3<21>,_Detail::MatsumotoKuritaTempering<3832420096U,_2609283072U>_>,_608087765U>
           *this)

{
  int local_9f0;
  result_type local_9ec;
  int iterations;
  result_type x;
  uint *p;
  uint local_9d8 [2];
  uint state [624];
  WellTestCase<Well<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_Detail::M3<_25>,_Detail::M3<27>,_Detail::M2<9>,_Detail::M3<1>,_Detail::M1,_Detail::M3<_9>,_Detail::M3<_21>,_Detail::M3<21>,_Detail::MatsumotoKuritaTempering<3832420096U,_2609283072U>_>,_608087765U>
  *this_local;
  
  p._4_4_ = 1;
  std::uninitialized_fill_n<unsigned_int*,unsigned_long,int>(local_9d8,0x270,(int *)((long)&p + 4));
  _iterations = local_9d8;
  Well<unsigned_int,32ul,624ul,31ul,70ul,179ul,449ul,Detail::M3<-25>,Detail::M3<27>,Detail::M2<9>,Detail::M3<1>,Detail::M1,Detail::M3<-9>,Detail::M3<-21>,Detail::M3<21>,Detail::MatsumotoKuritaTempering<3832420096u,2609283072u>>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,624ul,31ul,70ul,179ul,449ul,Detail::M3<_25>,Detail::M3<27>,Detail::M2<9>,Detail::M3<1>,Detail::M1,Detail::M3<_9>,Detail::M3<_21>,Detail::M3<21>,Detail::MatsumotoKuritaTempering<3832420096u,2609283072u>>
              *)this,(uint **)&iterations,state + 0x26e);
  local_9ec = 0;
  local_9f0 = 1000000000;
  while (0 < local_9f0) {
    local_9ec = Well<unsigned_int,_32UL,_624UL,_31UL,_70UL,_179UL,_449UL,_Detail::M3<-25>,_Detail::M3<27>,_Detail::M2<9>,_Detail::M3<1>,_Detail::M1,_Detail::M3<-9>,_Detail::M3<-21>,_Detail::M3<21>,_Detail::MatsumotoKuritaTempering<3832420096U,_2609283072U>_>
                ::operator()(&this->rng);
    local_9f0 = local_9f0 + -1;
  }
  return local_9ec;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }